

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

bool __thiscall
PartiallySignedTransaction::AddInput(PartiallySignedTransaction *this,CTxIn *txin,PSBTInput *psbtin)

{
  long lVar1;
  bool bVar2;
  iterator this_00;
  __normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> in_RSI;
  value_type *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  __normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> __first;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __first._M_current = (CTxIn *)in_RDI;
  std::optional<CMutableTransaction>::operator->
            ((optional<CMutableTransaction> *)
             CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::begin((vector<CTxIn,_std::allocator<CTxIn>_> *)in_RDI)
  ;
  std::optional<CMutableTransaction>::operator->
            ((optional<CMutableTransaction> *)
             CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  this_00 = std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_RDI);
  std::find<__gnu_cxx::__normal_iterator<CTxIn*,std::vector<CTxIn,std::allocator<CTxIn>>>,CTxIn>
            (__first,in_RSI,(CTxIn *)in_RDI);
  std::optional<CMutableTransaction>::operator->
            ((optional<CMutableTransaction> *)
             CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::end((vector<CTxIn,_std::allocator<CTxIn>_> *)in_RDI);
  bVar2 = __gnu_cxx::operator==<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                    ((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                     this_00._M_current,
                     (__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                     in_RDI);
  bVar2 = ((bVar2 ^ 0xffU) & 1) == 0;
  if (bVar2) {
    std::optional<CMutableTransaction>::operator->
              ((optional<CMutableTransaction> *)
               CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::push_back
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)this_00._M_current,(value_type *)in_RDI);
    std::
    map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
    ::clear((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    CScript::clear((CScript *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    CScriptWitness::SetNull
              ((CScriptWitness *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    std::vector<PSBTInput,_std::allocator<PSBTInput>_>::push_back
              ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)this_00._M_current,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool PartiallySignedTransaction::AddInput(const CTxIn& txin, PSBTInput& psbtin)
{
    if (std::find(tx->vin.begin(), tx->vin.end(), txin) != tx->vin.end()) {
        return false;
    }
    tx->vin.push_back(txin);
    psbtin.partial_sigs.clear();
    psbtin.final_script_sig.clear();
    psbtin.final_script_witness.SetNull();
    inputs.push_back(psbtin);
    return true;
}